

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O3

__pid_t __thiscall
BS::thread_pool<(unsigned_char)'\x00'>::wait
          (thread_pool<(unsigned_char)__x00_> *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  unique_lock<std::mutex> tasks_lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->tasks_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  this->waiting = true;
  while ((this->tasks_running != 0 ||
         ((this->tasks).c.
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur !=
          (this->tasks).c.
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur))) {
    std::condition_variable::wait((unique_lock *)&this->tasks_done_cv);
  }
  this->waiting = false;
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return extraout_EAX;
}

Assistant:

void wait()
    {
#ifdef __cpp_exceptions
        if constexpr (wait_deadlock_checks_enabled)
        {
            if (this_thread::get_pool() == this)
                throw wait_deadlock();
        }
#endif
        std::unique_lock tasks_lock(tasks_mutex);
        waiting = true;
        tasks_done_cv.wait(tasks_lock,
            [this]
            {
                if constexpr (pause_enabled)
                    return (tasks_running == 0) && (paused || tasks.empty());
                else
                    return (tasks_running == 0) && tasks.empty();
            });
        waiting = false;
    }